

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

_Bool add_flag(artifact *art,wchar_t flag)

{
  _Bool _Var1;
  obj_property *poVar2;
  obj_property *prop;
  wchar_t flag_local;
  artifact *art_local;
  
  poVar2 = lookup_obj_property(3,flag);
  _Var1 = flag_has_dbg(art->flags,5,flag,"art->flags","flag");
  if (!_Var1) {
    flag_on_dbg(art->flags,5,flag,"art->flags","flag");
    file_putf(log_file,"Adding ability: %s\n",poVar2->name);
  }
  art_local._7_1_ = !_Var1;
  return art_local._7_1_;
}

Assistant:

static bool add_flag(struct artifact *art, int flag)
{
	struct obj_property *prop = lookup_obj_property(OBJ_PROPERTY_FLAG, flag);
	if (of_has(art->flags, flag))
		return false;

	of_on(art->flags, flag);
	file_putf(log_file, "Adding ability: %s\n", prop->name);

	return true;
}